

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.cc
# Opt level: O1

string * gutil::anon_unknown_4::getValue(string *__return_storage_ptr__,string *s)

{
  pointer pcVar1;
  ulong uVar2;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (s->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + s->_M_string_length);
  uVar2 = std::__cxx11::string::find((char)__return_storage_ptr__,0x23);
  if (uVar2 < __return_storage_ptr__->_M_string_length) {
    std::__cxx11::string::substr((ulong)local_38,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_38);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
  }
  trim(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string getValue(const std::string &s)
{
  std::string ret=s;
  size_t pos=ret.find('#');

  if (pos < ret.size())
  {
    ret=ret.substr(0, pos);
  }

  trim(ret);

  return ret;
}